

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O0

CURLcode smb_connect(Curl_easy *data,_Bool *done)

{
  connectdata *conn_00;
  void *pvVar1;
  char *pcVar2;
  char *local_38;
  char *slash;
  smb_conn *smbc;
  connectdata *conn;
  _Bool *done_local;
  Curl_easy *data_local;
  
  conn_00 = data->conn;
  if ((data->state).aptr.user == (char *)0x0) {
    data_local._4_4_ = CURLE_LOGIN_DENIED;
  }
  else {
    (conn_00->proto).smbc.state = SMB_CONNECTING;
    pvVar1 = (*Curl_cmalloc)(0x9000);
    (conn_00->proto).ftpc.pp.sendleft = (size_t)pvVar1;
    if ((conn_00->proto).ftpc.pp.sendleft == 0) {
      data_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      Curl_conncontrol(conn_00,0);
      local_38 = strchr(conn_00->user,0x2f);
      if (local_38 == (char *)0x0) {
        local_38 = strchr(conn_00->user,0x5c);
      }
      if (local_38 == (char *)0x0) {
        (conn_00->proto).ftpc.pp.cache_size = (size_t)conn_00->user;
        pcVar2 = (*Curl_cstrdup)((conn_00->host).name);
        (conn_00->proto).ftpc.pp.nread_resp = (size_t)pcVar2;
        if ((conn_00->proto).ftpc.pp.nread_resp == 0) {
          return CURLE_OUT_OF_MEMORY;
        }
      }
      else {
        (conn_00->proto).ftpc.pp.cache_size = (size_t)(local_38 + 1);
        pcVar2 = (*Curl_cstrdup)(conn_00->user);
        (conn_00->proto).ftpc.pp.nread_resp = (size_t)pcVar2;
        if ((conn_00->proto).ftpc.pp.nread_resp == 0) {
          return CURLE_OUT_OF_MEMORY;
        }
        local_38[(conn_00->proto).ftpc.pp.nread_resp - (long)conn_00->user] = '\0';
      }
      data_local._4_4_ = CURLE_OK;
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode smb_connect(struct Curl_easy *data, bool *done)
{
  struct connectdata *conn = data->conn;
  struct smb_conn *smbc = &conn->proto.smbc;
  char *slash;

  (void) done;

  /* Check we have a username and password to authenticate with */
  if(!data->state.aptr.user)
    return CURLE_LOGIN_DENIED;

  /* Initialize the connection state */
  smbc->state = SMB_CONNECTING;
  smbc->recv_buf = malloc(MAX_MESSAGE_SIZE);
  if(!smbc->recv_buf)
    return CURLE_OUT_OF_MEMORY;

  /* Multiple requests are allowed with this connection */
  connkeep(conn, "SMB default");

  /* Parse the username, domain, and password */
  slash = strchr(conn->user, '/');
  if(!slash)
    slash = strchr(conn->user, '\\');

  if(slash) {
    smbc->user = slash + 1;
    smbc->domain = strdup(conn->user);
    if(!smbc->domain)
      return CURLE_OUT_OF_MEMORY;
    smbc->domain[slash - conn->user] = 0;
  }
  else {
    smbc->user = conn->user;
    smbc->domain = strdup(conn->host.name);
    if(!smbc->domain)
      return CURLE_OUT_OF_MEMORY;
  }

  return CURLE_OK;
}